

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Chip::GenerateBlock2(Chip *this,Bitu total,Bit32s *output)

{
  Bit32u BVar1;
  long *plVar2;
  code *local_50;
  Channel *local_30;
  Channel *ch;
  int count;
  Bit32u samples;
  Bit32s *output_local;
  Bitu total_local;
  Chip *this_local;
  
  _count = output;
  for (output_local._4_4_ = total; output_local._4_4_ != 0;
      output_local._4_4_ = output_local._4_4_ - BVar1) {
    BVar1 = ForwardLFO(this,output_local._4_4_);
    memset(_count,0,(ulong)BVar1 << 2);
    local_30 = this->chan;
    while (local_30 < this->chan + 9) {
      local_50 = (code *)local_30->synthHandler;
      plVar2 = (long *)((long)&local_30->op[0].volHandler + *(long *)&local_30->field_0xd8);
      if (((ulong)local_50 & 1) != 0) {
        local_50 = *(code **)(local_50 + *plVar2 + -1);
      }
      local_30 = (Channel *)(*local_50)(plVar2,this,BVar1,_count);
    }
    _count = _count + BVar1;
  }
  return;
}

Assistant:

void Chip::GenerateBlock2( Bitu total, Bit32s* output ) {
	while ( total > 0 ) {
		Bit32u samples = ForwardLFO( total );
		memset(output, 0, sizeof(Bit32s) * samples);
		int count = 0;
		for( Channel* ch = chan; ch < chan + 9; ) {
			count++;
			ch = (ch->*(ch->synthHandler))( this, samples, output );
		}
		total -= samples;
		output += samples;
	}
}